

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O2

void __thiscall
glcts::anon_unknown_0::SubRoutineLocLinkMaxNumOfLocations::~SubRoutineLocLinkMaxNumOfLocations
          (SubRoutineLocLinkMaxNumOfLocations *this)

{
  deqp::SubcaseBase::~SubcaseBase((SubcaseBase *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

virtual long Run()
	{

		GLint max;
		glGetIntegerv(GL_MAX_SUBROUTINE_UNIFORM_LOCATIONS, &max);
		SubroutineFunctionSet		   functions_st0(uniformValueGenerator, 2);
		std::vector<SubroutineUniform> subroutineUniforms;
		subroutineUniforms.push_back(
			SubroutineUniform(uniformValueGenerator, functions_st0, Loc::C(0), max, DefOccurence::FSH_OR_CSH, false));
		subroutineUniforms.push_back(
			SubroutineUniform(uniformValueGenerator, functions_st0, Loc::Implicit(), 0, DefOccurence::FSH_OR_CSH));
		return doRunNegativeLink(subroutineUniforms);
	}